

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.hpp
# Opt level: O1

void __thiscall
pg::Solvers::_add(Solvers *this,string *id,string *description,bool isParallel,
                 SolverConstructor *constructor)

{
  pointer pcVar1;
  mapped_type *this_00;
  long *local_78 [2];
  long local_68 [2];
  bool local_58;
  _Any_data local_50;
  code *local_40;
  
  pcVar1 = (description->_M_dataplus)._M_p;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar1,pcVar1 + description->_M_string_length);
  local_58 = isParallel;
  std::
  function<std::unique_ptr<pg::Solver,_std::default_delete<pg::Solver>_>_(pg::Oink_&,_pg::Game_&)>::
  function((function<std::unique_ptr<pg::Solver,_std::default_delete<pg::Solver>_>_(pg::Oink_&,_pg::Game_&)>
            *)&local_50,constructor);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pg::Solvers::SolverInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pg::Solvers::SolverInfo>_>_>
            ::operator[](&this->solvers,id);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_78);
  this_00->isParallel = local_58;
  std::
  function<std::unique_ptr<pg::Solver,_std::default_delete<pg::Solver>_>_(pg::Oink_&,_pg::Game_&)>::
  operator=(&this_00->constructor,
            (function<std::unique_ptr<pg::Solver,_std::default_delete<pg::Solver>_>_(pg::Oink_&,_pg::Game_&)>
             *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  return;
}

Assistant:

void _add(const std::string& id, const std::string& description, bool isParallel, const SolverConstructor& constructor)
    {
        solvers[id] = {description, isParallel, constructor};
    }